

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

string * __thiscall
cmGeneratorExpressionEvaluationFile::GetInputFileName_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorExpressionEvaluationFile *this,
          cmLocalGenerator *lg)

{
  bool bVar1;
  string local_78;
  string local_58;
  undefined1 local_21;
  cmLocalGenerator *local_20;
  cmLocalGenerator *lg_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  string *inputFileName;
  
  local_21 = 0;
  local_20 = lg;
  lg_local = (cmLocalGenerator *)this;
  this_local = (cmGeneratorExpressionEvaluationFile *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  bVar1 = cmsys::SystemTools::FileIsFullPath(__return_storage_ptr__);
  if (bVar1) {
    cmsys::SystemTools::CollapseFullPath(&local_58,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    FixRelativePath(&local_78,this,__return_storage_ptr__,PathForInput,local_20);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpressionEvaluationFile::GetInputFileName(
  cmLocalGenerator* lg)
{
  std::string inputFileName = this->Input;

  if (cmSystemTools::FileIsFullPath(inputFileName)) {
    inputFileName = cmSystemTools::CollapseFullPath(inputFileName);
  } else {
    inputFileName = this->FixRelativePath(inputFileName, PathForInput, lg);
  }

  return inputFileName;
}